

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O0

bool __thiscall
CustomServer::on_client_connect
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client)

{
  bool bVar1;
  element_type *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined1 local_40 [8];
  message<MsgType> msg;
  shared_ptr<blcl::net::connection<MsgType>_> *client_local;
  CustomServer *this_local;
  
  msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)client;
  bVar1 = is_banned(this,client);
  if (!bVar1) {
    blcl::net::message<MsgType>::message((message<MsgType> *)local_40);
    local_40._0_4_ = ServerAccept;
    this_00 = std::
              __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)client);
    blcl::net::connection<MsgType>::send
              (this_00,(int)(message<MsgType> *)local_40,__buf,in_RCX,in_R8D);
    blcl::net::message<MsgType>::~message((message<MsgType> *)local_40);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool on_client_connect(std::shared_ptr<blcl::net::connection<MsgType>> client) override {
        if (is_banned(client)) {
            return false;
        }

        blcl::net::message<MsgType> msg;
        msg.header.id = MsgType::ServerAccept;
        client->send(msg);

        return true;
    }